

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O2

curltime Curl_now(void)

{
  int iVar1;
  timespec *__tv;
  curltime cVar2;
  timespec tsnow;
  timeval now;
  
  __tv = &tsnow;
  iVar1 = clock_gettime(1,(timespec *)&tsnow);
  if (iVar1 == 0) {
    now.tv_usec = tsnow.tv_nsec / 1000;
  }
  else {
    __tv = (timespec *)&now;
    gettimeofday((timeval *)__tv,(__timezone_ptr_t)0x0);
  }
  cVar2._8_8_ = now.tv_usec;
  cVar2.tv_sec = ((timeval *)__tv)->tv_sec;
  return cVar2;
}

Assistant:

struct curltime Curl_now(void)
{
  /*
  ** gettimeofday() is not granted to be increased monotonically, due to
  ** clock drifting and external source time synchronization it can jump
  ** forward or backward in time.
  */
  struct timeval now;
  struct curltime ret;
  (void)gettimeofday(&now, NULL);
  ret.tv_sec = now.tv_sec;
  ret.tv_usec = (int)now.tv_usec;
  return ret;
}